

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarModel::QCalendarModel(QCalendarModel *this,QObject *parent)

{
  undefined4 uVar1;
  undefined8 uVar2;
  QDate QVar3;
  StaticDayOfWeekAssociativeArray<QTextCharFormat> *in_RSI;
  QAbstractTableModel *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QLocale local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractTableModel::QAbstractTableModel(in_RDI,(QObject *)in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0f230;
  *(undefined4 *)(in_RDI + 0x10) = 1;
  *(undefined4 *)(in_RDI + 0x14) = 1;
  QCalendar::QCalendar((QCalendar *)(in_RDI + 0x18));
  uVar2 = QDate::currentDate();
  *(undefined8 *)(in_RDI + 0x20) = uVar2;
  QVar3 = QDate::fromJulianDay(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *(qint64 *)(in_RDI + 0x28) = QVar3.jd;
  QDate::QDate((QDate *)(in_RDI + 0x30),9999,0xc,0x1f);
  local_10 = *(undefined8 *)(in_RDI + 0x18);
  uVar1 = QDate::year(in_RDI + 0x20,local_10);
  *(undefined4 *)(in_RDI + 0x38) = uVar1;
  local_18 = *(undefined8 *)(in_RDI + 0x18);
  uVar1 = QDate::month(in_RDI + 0x20,local_18);
  *(undefined4 *)(in_RDI + 0x3c) = uVar1;
  QLocale::QLocale(&local_20);
  uVar1 = QLocale::firstDayOfWeek();
  QLocale::~QLocale(&local_20);
  *(undefined4 *)(in_RDI + 0x40) = uVar1;
  *(undefined4 *)(in_RDI + 0x44) = 2;
  in_RDI[0x48] = (QAbstractTableModel)0x1;
  StaticDayOfWeekAssociativeArray<QTextCharFormat>::StaticDayOfWeekAssociativeArray(in_RSI);
  QMap<QDate,_QTextCharFormat>::QMap((QMap<QDate,_QTextCharFormat> *)0x518585);
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)(in_RDI + 0xd0));
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCalendarModel::QCalendarModel(QObject *parent)
    : QAbstractTableModel(parent),
      m_firstColumn(1),
      m_firstRow(1),
      m_date(QDate::currentDate()),
      m_minimumDate(QDate::fromJulianDay(1)),
      m_maximumDate(9999, 12, 31),
      m_shownYear(m_date.year(m_calendar)),
      m_shownMonth(m_date.month(m_calendar)),
      m_firstDay(QLocale().firstDayOfWeek()),
      m_horizontalHeaderFormat(QCalendarWidget::ShortDayNames),
      m_weekNumbersShown(true),
      m_view(nullptr)
{
}